

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

bool __thiscall
slang::ast::NamedValueExpression::checkConstant(NamedValueExpression *this,EvalContext *context)

{
  LookupLocation *pLVar1;
  SubroutineSymbol *pSVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  bool bVar6;
  Frame *pFVar7;
  Symbol *pSVar8;
  Diagnostic *pDVar9;
  Scope *this_00;
  Scope *pSVar10;
  LookupLocation target;
  Diagnostic *local_110;
  Diagnostic *local_f8;
  Diagnostic *diag_1;
  Scope *scope_1;
  Scope *local_88;
  undefined4 local_80;
  undefined4 uStack_7c;
  _Optional_payload_base<bool> local_72;
  SourceLocation SStack_70;
  optional<bool> compare;
  Diagnostic *diag;
  Scope *scope;
  SubroutineSymbol *subroutine;
  Frame *frame;
  EvalContext *local_20;
  EvalContext *context_local;
  NamedValueExpression *this_local;
  
  local_20 = context;
  context_local = (EvalContext *)this;
  bitmask<slang::ast::EvalFlags>::bitmask
            ((bitmask<slang::ast::EvalFlags> *)((long)&frame + 7),IsScript);
  bVar6 = bitmask<slang::ast::EvalFlags>::has
                    (&context->flags,(bitmask<slang::ast::EvalFlags> *)((long)&frame + 7));
  if (bVar6) {
    this_local._7_1_ = true;
  }
  else {
    bVar6 = ValueExpressionBase::checkConstantBase(&this->super_ValueExpressionBase,local_20);
    if (bVar6) {
      bVar6 = EvalContext::inFunction(local_20);
      if (bVar6) {
        pFVar7 = EvalContext::topFrame(local_20);
        pSVar2 = pFVar7->subroutine;
        if (pSVar2 == (SubroutineSymbol *)0x0) {
          this_local._7_1_ = true;
        }
        else {
          if (((((this->super_ValueExpressionBase).symbol)->super_Symbol).kind == Parameter) ||
             ((((this->super_ValueExpressionBase).symbol)->super_Symbol).kind == EnumValue)) {
            pLVar1 = &pFVar7->lookupLocation;
            local_88 = pLVar1->scope;
            uVar3 = *(undefined8 *)&(pFVar7->lookupLocation).index;
            uVar4 = pLVar1->scope;
            uVar5 = pLVar1->index;
            target.index = uVar5;
            target.scope = (Scope *)uVar4;
            local_80 = (undefined4)uVar3;
            uStack_7c = (undefined4)((ulong)uVar3 >> 0x20);
            target._12_4_ = 0;
            local_72 = (_Optional_payload_base<bool>)
                       Symbol::isDeclaredBefore
                                 (&((this->super_ValueExpressionBase).symbol)->super_Symbol,target);
            scope_1._7_1_ = 1;
            bVar6 = std::optional<bool>::value_or<bool>
                              ((optional<bool> *)&local_72,(bool *)((long)&scope_1 + 7));
            if ((((bVar6 ^ 0xffU) & 1) != 0) &&
               (((this_00 = Symbol::getParentScope
                                      (&((this->super_ValueExpressionBase).symbol)->super_Symbol),
                 this_00 == (Scope *)0x0 ||
                 (pSVar8 = Scope::asSymbol(this_00), pSVar8->kind != Package)) ||
                (pSVar10 = LookupLocation::getScope(&pFVar7->lookupLocation), this_00 == pSVar10))))
            {
              pDVar9 = EvalContext::addDiag
                                 (local_20,(DiagCode)0x10000c,
                                  (this->super_ValueExpressionBase).super_Expression.sourceRange);
              pDVar9 = Diagnostic::operator<<
                                 (pDVar9,(((this->super_ValueExpressionBase).symbol)->super_Symbol).
                                         name);
              Diagnostic::addNote(pDVar9,(DiagCode)0x40001,
                                  (((this->super_ValueExpressionBase).symbol)->super_Symbol).
                                  location);
              return false;
            }
          }
          else {
            diag = (Diagnostic *)
                   Symbol::getParentScope(&((this->super_ValueExpressionBase).symbol)->super_Symbol)
            ;
            while( true ) {
              bVar6 = false;
              if (diag != (Diagnostic *)0x0) {
                local_f8 = (Diagnostic *)0x0;
                if (pSVar2 != (SubroutineSymbol *)0x0) {
                  local_f8 = (Diagnostic *)&pSVar2->super_Scope;
                }
                bVar6 = diag != local_f8;
              }
              if (!bVar6) break;
              pSVar8 = Scope::asSymbol((Scope *)diag);
              diag = (Diagnostic *)Symbol::getParentScope(pSVar8);
            }
            local_110 = (Diagnostic *)0x0;
            if (pSVar2 != (SubroutineSymbol *)0x0) {
              local_110 = (Diagnostic *)&pSVar2->super_Scope;
            }
            if (diag != local_110) {
              pDVar9 = EvalContext::addDiag
                                 (local_20,(DiagCode)0xd000c,
                                  (this->super_ValueExpressionBase).super_Expression.sourceRange);
              SStack_70 = (((this->super_ValueExpressionBase).symbol)->super_Symbol).location;
              Diagnostic::addNote(pDVar9,(DiagCode)0x40001,SStack_70);
              return false;
            }
          }
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool NamedValueExpression::checkConstant(EvalContext& context) const {
    if (context.flags.has(EvalFlags::IsScript))
        return true;

    if (!checkConstantBase(context))
        return false;

    if (!context.inFunction())
        return true;

    const EvalContext::Frame& frame = context.topFrame();
    const SubroutineSymbol* subroutine = frame.subroutine;
    if (!subroutine)
        return true;

    // Constant functions have a bunch of additional restrictions. See [13.4.4]:
    // - All parameter values used within the function shall be defined before the use of
    //   the invoking constant function call.
    // - All identifiers that are not parameters or functions shall be declared locally to
    //   the current function.
    if (symbol.kind != SymbolKind::Parameter && symbol.kind != SymbolKind::EnumValue) {
        const Scope* scope = symbol.getParentScope();
        while (scope && scope != subroutine)
            scope = scope->asSymbol().getParentScope();

        if (scope != subroutine) {
            auto& diag = context.addDiag(diag::ConstEvalFunctionIdentifiersMustBeLocal,
                                         sourceRange);
            diag.addNote(diag::NoteDeclarationHere, symbol.location);
            return false;
        }
    }
    else {
        // Check whether the referenced parameter is declared prior to the invocation
        // of the constant function. If the two locations are not in the same compilation
        // unit, assume that it's ok. Also if the reference is via a package import
        // that's fine too.
        auto compare = symbol.isDeclaredBefore(frame.lookupLocation);
        if (!compare.value_or(true)) {
            auto scope = symbol.getParentScope();
            if (!scope || scope->asSymbol().kind != SymbolKind::Package ||
                scope == frame.lookupLocation.getScope()) {

                auto& diag = context.addDiag(diag::ConstEvalIdUsedInCEBeforeDecl, sourceRange)
                             << symbol.name;
                diag.addNote(diag::NoteDeclarationHere, symbol.location);
                return false;
            }
        }
    }

    return true;
}